

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void ifft8pt(float *ioptr,float scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float Two;
  float t1i;
  float t1r;
  float t0i;
  float t0r;
  float f7i;
  float f7r;
  float f6i;
  float f6r;
  float f5i;
  float f5r;
  float f4i;
  float f4r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float w0r;
  float scale_local;
  float *ioptr_local;
  
  fVar1 = *ioptr + ioptr[8];
  fVar2 = ioptr[1] + ioptr[9];
  fVar10 = *ioptr - ioptr[8];
  fVar11 = ioptr[1] - ioptr[9];
  fVar12 = ioptr[4] - ioptr[0xc];
  fVar13 = ioptr[5] - ioptr[0xd];
  fVar3 = ioptr[4] + ioptr[0xc];
  fVar4 = ioptr[5] + ioptr[0xd];
  fVar5 = fVar1 + fVar3;
  fVar6 = fVar2 + fVar4;
  fVar1 = fVar1 - fVar3;
  fVar2 = fVar2 - fVar4;
  fVar3 = fVar10 + fVar13;
  fVar14 = fVar11 - fVar12;
  fVar10 = fVar10 - fVar13;
  fVar11 = fVar11 + fVar12;
  fVar4 = ioptr[2] + ioptr[10];
  fVar12 = ioptr[3] + ioptr[0xb];
  fVar15 = ioptr[2] - ioptr[10];
  fVar16 = ioptr[3] - ioptr[0xb];
  fVar17 = ioptr[6] - ioptr[0xe];
  fVar18 = ioptr[7] - ioptr[0xf];
  fVar13 = ioptr[6] + ioptr[0xe];
  fVar7 = ioptr[7] + ioptr[0xf];
  fVar8 = fVar4 + fVar13;
  fVar9 = fVar12 + fVar7;
  fVar4 = fVar4 - fVar13;
  fVar12 = fVar12 - fVar7;
  fVar13 = fVar15 + fVar18;
  fVar19 = fVar16 - fVar17;
  fVar15 = fVar15 - fVar18;
  fVar16 = fVar16 + fVar17;
  fVar7 = (fVar10 - fVar15 * 0.70710677) + fVar16 * 0.70710677;
  fVar17 = (fVar11 - fVar15 * 0.70710677) - fVar16 * 0.70710677;
  fVar16 = fVar3 + fVar13 * 0.70710677 + fVar19 * 0.70710677;
  fVar13 = (fVar14 - fVar13 * 0.70710677) + fVar19 * 0.70710677;
  *ioptr = scale * (fVar5 + fVar8);
  ioptr[1] = scale * (fVar6 + fVar9);
  ioptr[2] = scale * (fVar10 * 2.0 - fVar7);
  ioptr[3] = scale * (fVar11 * 2.0 - fVar17);
  ioptr[4] = scale * (fVar1 - fVar12);
  ioptr[5] = scale * (fVar2 + fVar4);
  ioptr[6] = scale * (fVar3 * 2.0 - fVar16);
  ioptr[7] = scale * (fVar14 * 2.0 - fVar13);
  ioptr[8] = scale * (fVar5 - fVar8);
  ioptr[9] = scale * (fVar6 - fVar9);
  ioptr[10] = scale * fVar7;
  ioptr[0xb] = scale * fVar17;
  ioptr[0xc] = scale * (fVar1 + fVar12);
  ioptr[0xd] = scale * (fVar2 - fVar4);
  ioptr[0xe] = scale * fVar16;
  ioptr[0xf] = scale * fVar13;
  return;
}

Assistant:

static inline void ifft8pt(float *ioptr, float scale) {
/***   RADIX 8 ifft	***/
float w0r = 1.0/MYROOT2; /* cos(pi/4)	*/
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

	/* bit reversed load */
f0r = ioptr[0];
f0i = ioptr[1];
f1r = ioptr[8];
f1i = ioptr[9];
f2r = ioptr[4];
f2i = ioptr[5];
f3r = ioptr[12];
f3i = ioptr[13];
f4r = ioptr[2];
f4i = ioptr[3];
f5r = ioptr[10];
f5i = ioptr[11];
f6r = ioptr[6];
f6i = ioptr[7];
f7r = ioptr[14];
f7i = ioptr[15];

			/* Butterflys		*/
			/*
			f0	-	-	t0	-	-	f0	-	-	f0
			f1	-  1 -	f1	-	-	f1	-	-	f1
			f2	-	-	f2	-  1 -	f2	-	-	f2
			f3	-  1 -	t1	-  i -	f3	-	-	f3
			f4	-	-	t0	-	-	f4	-  1 -	t0
			f5	-  1 -	f5	-	-	f5	- w3 -	f4
			f6	-	-	f6	-  1 -	f6	-  i -	t1
			f7	-  1 -	t1	-  i -	f7	- iw3-	f6
			*/

t0r = f0r + f1r;
t0i = f0i + f1i;
f1r = f0r - f1r;
f1i = f0i - f1i;

t1r = f2r - f3r;
t1i = f2i - f3i;
f2r = f2r + f3r;
f2i = f2i + f3i;

f0r = t0r + f2r;
f0i = t0i + f2i;
f2r = t0r - f2r;
f2i = t0i - f2i;

f3r = f1r + t1i;
f3i = f1i - t1r;
f1r = f1r - t1i;
f1i = f1i + t1r;


t0r = f4r + f5r;
t0i = f4i + f5i;
f5r = f4r - f5r;
f5i = f4i - f5i;

t1r = f6r - f7r;
t1i = f6i - f7i;
f6r = f6r + f7r;
f6i = f6i + f7i;

f4r = t0r + f6r;
f4i = t0i + f6i;
f6r = t0r - f6r;
f6i = t0i - f6i;

f7r = f5r + t1i;
f7i = f5i - t1r;
f5r = f5r - t1i;
f5i = f5i + t1r;


t0r = f0r - f4r;
t0i = f0i - f4i;
f0r = f0r + f4r;
f0i = f0i + f4i;

t1r = f2r + f6i;
t1i = f2i - f6r;
f2r = f2r - f6i;
f2i = f2i + f6r;

f4r = f1r - f5r * w0r + f5i * w0r;
f4i = f1i - f5r * w0r - f5i * w0r;
f1r = f1r * Two - f4r;
f1i = f1i * Two - f4i;

f6r = f3r + f7r * w0r + f7i * w0r;
f6i = f3i - f7r * w0r + f7i * w0r;
f3r = f3r * Two - f6r;
f3i = f3i * Two - f6i;

	/* store result */
ioptr[0] = scale*f0r;
ioptr[1] = scale*f0i;
ioptr[2] = scale*f1r;
ioptr[3] = scale*f1i;
ioptr[4] = scale*f2r;
ioptr[5] = scale*f2i;
ioptr[6] = scale*f3r;
ioptr[7] = scale*f3i;
ioptr[8] = scale*t0r;
ioptr[9] = scale*t0i;
ioptr[10] = scale*f4r;
ioptr[11] = scale*f4i;
ioptr[12] = scale*t1r;
ioptr[13] = scale*t1i;
ioptr[14] = scale*f6r;
ioptr[15] = scale*f6i;
}